

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>::push_back
          (SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false> *this,NameIndex *Elt)

{
  undefined8 *puVar1;
  uint uVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  DWARFDebugNames *pDVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  long lVar14;
  
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
      super_SmallVectorBase.Capacity <=
      (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
      super_SmallVectorBase.Size) {
    grow(this,0);
  }
  pvVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
           super_SmallVectorBase.BeginX;
  lVar14 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
                  super_SmallVectorBase.Size * 0x98;
  puVar1 = (undefined8 *)((long)pvVar3 + lVar14);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined4 *)(puVar1 + 2) = 0;
  *puVar1 = (Elt->Abbrevs).
            super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
            .TheMap.Buckets;
  (Elt->Abbrevs).
  super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
  .TheMap.Buckets = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0;
  uVar2 = *(uint *)(puVar1 + 1);
  *(uint *)(puVar1 + 1) =
       (Elt->Abbrevs).
       super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
       .TheMap.NumEntries;
  (Elt->Abbrevs).
  super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
  .TheMap.NumEntries = uVar2;
  uVar2 = *(uint *)((long)puVar1 + 0xc);
  *(uint *)((long)puVar1 + 0xc) =
       (Elt->Abbrevs).
       super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
       .TheMap.NumTombstones;
  (Elt->Abbrevs).
  super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
  .TheMap.NumTombstones = uVar2;
  uVar2 = *(uint *)(puVar1 + 2);
  *(uint *)(puVar1 + 2) =
       (Elt->Abbrevs).
       super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
       .TheMap.NumBuckets;
  (Elt->Abbrevs).
  super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
  .TheMap.NumBuckets = uVar2;
  *(uint32_t *)(puVar1 + 7) = (Elt->Hdr).super_HeaderPOD.AugmentationStringSize;
  uVar4 = *(undefined8 *)&(Elt->Hdr).super_HeaderPOD;
  uVar5 = *(undefined8 *)&(Elt->Hdr).super_HeaderPOD.CompUnitCount;
  uVar6 = *(undefined8 *)&(Elt->Hdr).super_HeaderPOD.NameCount;
  puVar1[5] = *(undefined8 *)&(Elt->Hdr).super_HeaderPOD.ForeignTypeUnitCount;
  puVar1[6] = uVar6;
  puVar1[3] = uVar4;
  puVar1[4] = uVar5;
  SmallVector<char,_8U>::SmallVector
            ((SmallVector<char,_8U> *)(puVar1 + 8),
             &(Elt->Hdr).AugmentationString.super_SmallVector<char,_8U>);
  pDVar7 = Elt->Section;
  uVar8 = Elt->Base;
  uVar9 = Elt->CUsBase;
  uVar10 = Elt->BucketsBase;
  uVar11 = Elt->HashesBase;
  uVar12 = Elt->StringOffsetsBase;
  uVar13 = Elt->EntriesBase;
  *(uint64_t *)((long)pvVar3 + lVar14 + 0x88) = Elt->EntryOffsetsBase;
  *(uint64_t *)((long)pvVar3 + lVar14 + 0x90) = uVar13;
  *(uint64_t *)((long)pvVar3 + lVar14 + 0x78) = uVar11;
  *(uint64_t *)((long)pvVar3 + lVar14 + 0x80) = uVar12;
  *(uint64_t *)((long)pvVar3 + lVar14 + 0x68) = uVar9;
  *(uint64_t *)((long)pvVar3 + lVar14 + 0x70) = uVar10;
  *(DWARFDebugNames **)((long)pvVar3 + lVar14 + 0x58) = pDVar7;
  *(uint64_t *)((long)pvVar3 + lVar14 + 0x60) = uVar8;
  uVar2 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
          super_SmallVectorBase.Size;
  if (uVar2 < (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
    super_SmallVectorBase.Size = uVar2 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }